

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aspif_text.cpp
# Opt level: O0

void __thiscall Potassco::AspifTextOutput::visitTheories(AspifTextOutput *this)

{
  uint uVar1;
  TheoryData *td;
  ostream *poVar2;
  undefined8 uVar3;
  string *in_RDI;
  Atom_t unaff_retaddr;
  AspifTextOutput *in_stack_00000008;
  string name;
  Atom_t atom;
  atom_iterator end;
  atom_iterator it;
  BuildStr toStr;
  AspifTextOutput *in_stack_ffffffffffffff38;
  undefined4 in_stack_ffffffffffffff40;
  undefined4 in_stack_ffffffffffffff44;
  string local_80 [36];
  uint local_5c;
  TheoryData *local_58;
  TheoryAtom *in_stack_ffffffffffffffb8;
  TheoryAtomStringBuilder *in_stack_ffffffffffffffc8;
  string *str;
  
  str = in_RDI;
  visitTheories()::BuildStr::BuildStr(Potassco::AspifTextOutput__
            ((BuildStr *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
             in_stack_ffffffffffffff38);
  td = (TheoryData *)
       TheoryData::currBegin
                 ((TheoryData *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40));
  local_58 = (TheoryData *)
             TheoryData::end((TheoryData *)
                             CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40));
  do {
    if (td == local_58) {
      visitTheories::BuildStr::~BuildStr((BuildStr *)0x112186);
      return;
    }
    local_5c = TheoryAtom::atom((TheoryAtom *)td->data_);
    TheoryAtomStringBuilder::toString_abi_cxx11_
              (in_stack_ffffffffffffffc8,td,in_stack_ffffffffffffffb8);
    uVar1 = local_5c;
    if (local_5c == 0) {
      poVar2 = std::operator<<((ostream *)in_RDI->_M_string_length,local_80);
      std::operator<<(poVar2,".\n");
    }
    else {
      if (local_5c <= *(uint *)((long)&in_RDI[1]._M_string_length + 4)) {
        uVar3 = std::__cxx11::string::c_str();
        fail(-2,"void Potassco::AspifTextOutput::visitTheories()",0x2be,"atom > maxAtom_",
             "Redefinition: theory atom \'%u:%s\' already defined in a previous step",(ulong)uVar1,
             uVar3,0);
      }
      assignAtomName(in_stack_00000008,unaff_retaddr,str);
    }
    std::__cxx11::string::~string(local_80);
    td = td + 1;
  } while( true );
}

Assistant:

void AspifTextOutput::visitTheories() {
	struct BuildStr : public TheoryAtomStringBuilder {
		explicit BuildStr(AspifTextOutput& s) : self(&s) {}
		virtual LitSpan getCondition(Id_t condId) const {
			return self->data_->getCondition(condId);
		}
		virtual std::string getName(Atom_t id) const {
			if (const std::string* name = self->data_->getAtomName(id)) {
				return *name;
			}
			return std::string("x_").append(Potassco::toString(id));
		}
		AspifTextOutput* self;
	} toStr(*this);
	for (TheoryData::atom_iterator it = theory_.currBegin(), end = theory_.end(); it != end; ++it) {
		Atom_t atom = (*it)->atom();
		std::string name = toStr.toString(theory_, **it);
		if (!atom) {
			os_ << name << ".\n";
		}
		else {
			POTASSCO_REQUIRE(atom > maxAtom_, "Redefinition: theory atom '%u:%s' already defined in a previous step", atom, name.c_str());
			assignAtomName(atom, name);
		}
	}
}